

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
wallet::CCoinControl::GetSequence(CCoinControl *this,COutPoint *outpoint)

{
  bool bVar1;
  PreselectedInput *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  key_type *in_stack_ffffffffffffffb8;
  _Self *in_stack_ffffffffffffffc8;
  _Optional_payload_base<unsigned_int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::find((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          *)in_RDI,in_stack_ffffffffffffffb8);
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::end((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
         *)in_RDI);
  bVar1 = std::operator==(in_stack_ffffffffffffffc8,(_Self *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_10);
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_> *)
               in_stack_ffffffffffffffb8);
    local_10 = (_Optional_payload_base<unsigned_int>)PreselectedInput::GetSequence(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<unsigned_int>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint32_t> CCoinControl::GetSequence(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() ? it->second.GetSequence() : std::nullopt;
}